

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintEnum
          (FieldValuePrinterWrapper *this,int32_t val,string *name,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_58 [32];
  string_view local_38;
  BaseTextGenerator *local_28;
  BaseTextGenerator *generator_local;
  string *name_local;
  FieldValuePrinterWrapper *pFStack_10;
  int32_t val_local;
  FieldValuePrinterWrapper *this_local;
  
  local_28 = generator;
  generator_local = (BaseTextGenerator *)name;
  name_local._4_4_ = val;
  pFStack_10 = this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[0xb])(local_58,pFVar1,(ulong)name_local._4_4_,generator_local);
  local_38 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
  TextFormat::BaseTextGenerator::PrintString(generator,local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void PrintEnum(int32_t val, const std::string& name,
                 TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintEnum(val, name));
  }